

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  EnvironmentType EVar3;
  PlannerType PVar4;
  ostream *poVar5;
  char *__s1;
  long in_RSI;
  int in_EDI;
  int plannerRes;
  char *motPrimFilename;
  bool usingMotionPrimitives;
  bool forwardSearch;
  PlannerType planner;
  EnvironmentType environment;
  int envArgIdx;
  string searchDir;
  string plannerType;
  string environmentType;
  bool navigating;
  int i;
  int numOptions;
  bool in_stack_00000167;
  char *in_stack_00000168;
  PlannerType in_stack_00000174;
  char *in_stack_00000198;
  PlannerType in_stack_000001a4;
  undefined1 in_stack_00000237;
  char *in_stack_00000238;
  PlannerType in_stack_00000244;
  undefined1 in_stack_0000028f;
  char *in_stack_00000290;
  char *in_stack_00000298;
  PlannerType in_stack_000002a0;
  char *in_stack_00000628;
  PlannerType in_stack_00000634;
  undefined1 in_stack_000006ff;
  char *in_stack_00000700;
  char *in_stack_00000708;
  PlannerType in_stack_00000710;
  undefined1 in_stack_0000088f;
  char *in_stack_00000890;
  char *in_stack_00000898;
  PlannerType in_stack_000008a0;
  char **in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  char **in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  int local_b0;
  string local_90 [48];
  string local_60 [32];
  string local_40 [39];
  byte local_19;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  uint local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  if ((in_EDI == 2) && (iVar1 = strcmp(*(char **)(in_RSI + 8),"-h"), iVar1 == 0)) {
    PrintHelp((char **)0x113465);
    return 0;
  }
  if (local_8 < 2) {
    PrintUsage((char **)0x11348c);
    return 2;
  }
  local_14 = 0;
  for (local_18 = 1; iVar1 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20), local_18 < local_8;
      local_18 = local_18 + 1) {
    iVar2 = strncmp("-",*(char **)(local_10 + (long)local_18 * 8),1);
    iVar1 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    if (iVar2 != 0) break;
    local_14 = local_14 + 1;
  }
  local_19 = CheckIsNavigating(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  CheckEnvironmentType_abi_cxx11_(iVar1,in_stack_ffffffffffffff30);
  CheckPlannerType_abi_cxx11_(iVar1,in_stack_ffffffffffffff30);
  CheckSearchDirection_abi_cxx11_(iVar1,in_stack_ffffffffffffff30);
  poVar5 = std::operator<<((ostream *)&std::cout,"Environment: ");
  poVar5 = std::operator<<(poVar5,local_40);
  poVar5 = std::operator<<(poVar5,"; Planner: ");
  poVar5 = std::operator<<(poVar5,local_60);
  poVar5 = std::operator<<(poVar5,"; Search direction: ");
  poVar5 = std::operator<<(poVar5,local_90);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::c_str();
  EVar3 = StrToEnvironmentType((char *)in_stack_fffffffffffffee8);
  std::__cxx11::string::c_str();
  PVar4 = StrToPlannerType((char *)in_stack_fffffffffffffee8);
  __s1 = (char *)std::__cxx11::string::c_str();
  strcmp(__s1,"forward");
  if ((EVar3 == INVALID_ENV_TYPE) || (PVar4 == INVALID_PLANNER_TYPE)) {
    PrintUsage((char **)0x113717);
    local_4 = 3;
  }
  else {
    switch(EVar3) {
    case ENV_TYPE_2D:
      if ((local_19 & 1) == 0) {
        local_b0 = plan2d(in_stack_00000244,in_stack_00000238,(bool)in_stack_00000237);
      }
      else {
        local_b0 = planandnavigate2d(in_stack_00000634,in_stack_00000628);
      }
      break;
    case ENV_TYPE_2DUU:
      printf("Warning: planning in two dimensions under uncertainty is not fully implemented!\n");
      local_b0 = plan2duu(in_stack_000001a4,in_stack_00000198);
      break;
    case ENV_TYPE_XYTHETA:
      if ((local_19 & 1) == 0) {
        local_b0 = planxythetalat(in_stack_000002a0,in_stack_00000298,in_stack_00000290,
                                  (bool)in_stack_0000028f);
      }
      else {
        local_b0 = planandnavigatexythetalat
                             (in_stack_000008a0,in_stack_00000898,in_stack_00000890,
                              (bool)in_stack_0000088f);
      }
      break;
    case ENV_TYPE_XYTHETAMLEV:
      local_b0 = planxythetamlevlat(in_stack_00000710,in_stack_00000708,in_stack_00000700,
                                    (bool)in_stack_000006ff);
      break;
    case ENV_TYPE_ROBARM:
      local_b0 = planrobarm(in_stack_00000174,in_stack_00000168,in_stack_00000167);
      break;
    default:
      printf("Unsupported Environment Type...\n");
      PrintUsage((char **)0x113978);
      local_4 = 4;
      goto LAB_001139af;
    }
    local_4 = (uint)(local_b0 != 1);
  }
LAB_001139af:
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
    // Print help
    if (argc == 2 && strcmp(argv[1], "-h") == 0) {
        PrintHelp(argv);
        return MAIN_RESULT_SUCCESS;
    }
    else if (argc < 2) {
        PrintUsage(argv);
        return MAIN_RESULT_INSUFFICIENT_ARGS;
    }

    // Find the number of options passed in; cfg and motprim files come after all options
    // options include any string starting with "-"
    int numOptions = 0;
    for (int i = 1; i < argc; i++) {
        if (strncmp("-", argv[i], 1) == 0) {
            numOptions++;
        }
        else {
            break;
        }
    }

    // Check command line arguments to find environment type and whether or not to
    // use one of the navigating examples.
    bool navigating = CheckIsNavigating(numOptions, argv);
    std::string environmentType = CheckEnvironmentType(numOptions, argv);
    std::string plannerType = CheckPlannerType(numOptions, argv);
    std::string searchDir = CheckSearchDirection(numOptions, argv);

    std::cout << "Environment: " << environmentType << "; Planner: " << plannerType << "; Search direction: "
        << searchDir << std::endl;

    int envArgIdx = numOptions + 1;
    EnvironmentType environment = StrToEnvironmentType(environmentType.c_str());
    PlannerType planner = StrToPlannerType(plannerType.c_str());
    bool forwardSearch = !strcmp(searchDir.c_str(), "forward");

    bool usingMotionPrimitives = (argc == numOptions + 3);
    char* motPrimFilename = usingMotionPrimitives ? argv[envArgIdx + 1] : NULL;

    // make sure we've been given valid a valid environment
    if (environment == INVALID_ENV_TYPE || planner == INVALID_PLANNER_TYPE) {
        PrintUsage(argv);
        return MAIN_RESULT_INCORRECT_OPTIONS;
    }

    // Launch the correct example given the planner and an environment file.
    int plannerRes = 0;
    switch (environment) {
    case ENV_TYPE_2D:
        if (navigating) {
            plannerRes = planandnavigate2d(planner, argv[envArgIdx]);
        }
        else {
            plannerRes = plan2d(planner, argv[envArgIdx], forwardSearch);
        }
        break;
    case ENV_TYPE_2DUU:
        printf("Warning: planning in two dimensions under uncertainty is not fully implemented!\n");
        plannerRes = plan2duu(planner, argv[envArgIdx]);
        break;
    case ENV_TYPE_XYTHETA:
        if (navigating) {
            plannerRes = planandnavigatexythetalat(planner, argv[envArgIdx], motPrimFilename, forwardSearch);
        }
        else {
            plannerRes = planxythetalat(planner, argv[envArgIdx], motPrimFilename, forwardSearch);
        }
        break;
    case ENV_TYPE_XYTHETAMLEV:
        plannerRes = planxythetamlevlat(planner, argv[envArgIdx], motPrimFilename, forwardSearch);
        break;
    case ENV_TYPE_ROBARM:
        plannerRes = planrobarm(planner, argv[envArgIdx], forwardSearch);
        break;
    default:
        printf("Unsupported Environment Type...\n");
        PrintUsage(argv);
        return MAIN_RESULT_UNSUPPORTED_ENV;
    }

    return plannerRes == 1 ? MAIN_RESULT_SUCCESS : MAIN_RESULT_FAILURE;
}